

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode Curl_http2_upgrade(Curl_easy *data,connectdata *conn,int sockindex,char *mem,size_t nread)

{
  _Bool local_59;
  Curl_cfilter *pCStack_58;
  _Bool done;
  ssize_t copied;
  Curl_easy *pCStack_48;
  CURLcode result;
  cf_h2_ctx *ctx;
  Curl_cfilter *cf;
  size_t nread_local;
  char *mem_local;
  connectdata *pcStack_20;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  cf = (Curl_cfilter *)nread;
  nread_local = (size_t)mem;
  mem_local._4_4_ = sockindex;
  pcStack_20 = conn;
  conn_local = (connectdata *)data;
  copied._4_4_ = http2_cfilter_add((Curl_cfilter **)&ctx,data,conn,sockindex);
  data_local._4_4_ = copied._4_4_;
  if (copied._4_4_ == CURLE_OK) {
    pCStack_48 = (ctx->call_data).data;
    copied._4_4_ = cf_h2_ctx_init((Curl_cfilter *)ctx,(Curl_easy *)conn_local,true);
    data_local._4_4_ = copied._4_4_;
    if (copied._4_4_ == CURLE_OK) {
      if (cf != (Curl_cfilter *)0x0) {
        pCStack_58 = (Curl_cfilter *)
                     Curl_bufq_write((bufq *)&pCStack_48->prev,(uchar *)nread_local,(size_t)cf,
                                     (CURLcode *)((long)&copied + 4));
        if ((long)pCStack_58 < 0) {
          Curl_failf((Curl_easy *)conn_local,"error on copying HTTP Upgrade response: %d",
                     (ulong)copied._4_4_);
          return CURLE_RECV_ERROR;
        }
        if (pCStack_58 < cf) {
          Curl_failf((Curl_easy *)conn_local,
                     "connection buffer size could not take all data from HTTP Upgrade response header: copied=%zd, datalen=%zu"
                     ,pCStack_58,cf);
          return CURLE_HTTP2;
        }
        if ((conn_local != (connectdata *)0x0) &&
           ((*(ulong *)((long)&conn_local[2].options + 2) >> 0x1c & 1) != 0)) {
          Curl_infof((Curl_easy *)conn_local,
                     "Copied HTTP/2 data in stream buffer to connection buffer after upgrade: len=%zu"
                     ,cf);
        }
      }
      pcStack_20->httpversion = '\x14';
      pcStack_20->bits = (ConnectBits)((uint)pcStack_20->bits & 0xff7fffff | 0x800000);
      pcStack_20->bundle->multiuse = 2;
      Curl_multi_connchanged((Curl_multi *)(conn_local->socks_proxy).passwd);
      if (*(long *)&ctx->max_concurrent_streams == 0) {
        data_local._4_4_ = CURLE_OK;
      }
      else {
        data_local._4_4_ =
             Curl_conn_cf_connect((Curl_cfilter *)ctx,(Curl_easy *)conn_local,false,&local_59);
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_http2_upgrade(struct Curl_easy *data,
                            struct connectdata *conn, int sockindex,
                            const char *mem, size_t nread)
{
  struct Curl_cfilter *cf;
  struct cf_h2_ctx *ctx;
  CURLcode result;

  DEBUGASSERT(!Curl_conn_is_http2(data, conn, sockindex));
  DEBUGF(infof(data, "upgrading to HTTP/2"));
  DEBUGASSERT(data->req.upgr101 == UPGR101_RECEIVED);

  result = http2_cfilter_add(&cf, data, conn, sockindex);
  if(result)
    return result;

  DEBUGASSERT(cf->cft == &Curl_cft_nghttp2);
  ctx = cf->ctx;

  result = cf_h2_ctx_init(cf, data, TRUE);
  if(result)
    return result;

  if(nread > 0) {
    /* Remaining data from the protocol switch reply is already using
     * the switched protocol, ie. HTTP/2. We add that to the network
     * inbufq. */
    ssize_t copied;

    copied = Curl_bufq_write(&ctx->inbufq,
                             (const unsigned char *)mem, nread, &result);
    if(copied < 0) {
      failf(data, "error on copying HTTP Upgrade response: %d", result);
      return CURLE_RECV_ERROR;
    }
    if((size_t)copied < nread) {
      failf(data, "connection buffer size could not take all data "
            "from HTTP Upgrade response header: copied=%zd, datalen=%zu",
            copied, nread);
      return CURLE_HTTP2;
    }
    infof(data, "Copied HTTP/2 data in stream buffer to connection buffer"
          " after upgrade: len=%zu", nread);
  }

  conn->httpversion = 20; /* we know we're on HTTP/2 now */
  conn->bits.multiplex = TRUE; /* at least potentially multiplexed */
  conn->bundle->multiuse = BUNDLE_MULTIPLEX;
  Curl_multi_connchanged(data->multi);

  if(cf->next) {
    bool done;
    return Curl_conn_cf_connect(cf, data, FALSE, &done);
  }
  return CURLE_OK;
}